

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O2

void __thiscall
ConfidentialTransaction_GetIssuanceBlindingKeyTest_Test::
ConfidentialTransaction_GetIssuanceBlindingKeyTest_Test
          (ConfidentialTransaction_GetIssuanceBlindingKeyTest_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_005c7f50;
  return;
}

Assistant:

TEST(ConfidentialTransaction, GetIssuanceBlindingKeyTest) {
  Privkey masterkey(
      "a0cd219833629db30c5210716c7b2e22fb8dd10aa231692f1f53acd8e662de01");
  Txid txid(
      "21fe3fc8e38256ec747fa8d8ea96319fd00cbcf318c2586b9b8e9e27a5afe9aa");
  uint32_t vout = 0;
  Privkey key;
  EXPECT_NO_THROW(
    (key = ConfidentialTransaction::GetIssuanceBlindingKey(
        masterkey, txid, vout)));

  EXPECT_STREQ(
      key.GetHex().c_str(),
      "24c10c3b128f220e3b4253cec39ea3b75d2f6000033508c8deeadc1b6eefc4a1");
}